

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_interface_to_implementation.cpp
# Opt level: O0

int main(void)

{
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_i1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  *this;
  pointer piVar1;
  long local_28;
  unique_ptr<i1,_std::default_delete<i1>_> local_18;
  unique_ptr<i1,_std::default_delete<i1>_> object;
  i injector;
  
  object._M_t.super___uniq_ptr_impl<i1,_std::default_delete<i1>_>._M_t.
  super__Tuple_impl<0UL,_i1_*,_std::default_delete<i1>_>.super__Head_base<0UL,_i1_*,_false>.
  _M_head_impl._4_4_ = 0;
  this = boost::ext::di::v1_3_0::core::
         dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_i1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
         ::operator()((dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_i1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                       *)&boost::ext::di::v1_3_0::bind<i1>);
  boost::ext::di::v1_3_0::core::
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_i1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  ::to<impl1,_0,_0>(this);
  boost::ext::di::v1_3_0::
  make_injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_0,_0>
            ();
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  ::create<std::unique_ptr<i1,_std::default_delete<i1>_>,_0>
            ((injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
              *)&local_18);
  piVar1 = std::unique_ptr<i1,_std::default_delete<i1>_>::get(&local_18);
  if (piVar1 == (pointer)0x0) {
    local_28 = 0;
  }
  else {
    local_28 = __dynamic_cast(piVar1,&i1::typeinfo,&impl1::typeinfo,0);
  }
  if (local_28 != 0) {
    std::unique_ptr<i1,_std::default_delete<i1>_>::~unique_ptr(&local_18);
    return object._M_t.super___uniq_ptr_impl<i1,_std::default_delete<i1>_>._M_t.
           super__Tuple_impl<0UL,_i1_*,_std::default_delete<i1>_>.super__Head_base<0UL,_i1_*,_false>
           ._M_head_impl._4_4_;
  }
  __assert_fail("dynamic_cast<impl1*>(object.get())",
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/bind_interface_to_implementation.cpp"
                ,0x1f,"int main()");
}

Assistant:

int main() {
  // clang-format off
  auto injector = di::make_injector(
    di::bind<i1>().to<impl1>()
  );
  // clang-format on

  auto object = injector.create<std::unique_ptr<i1>>();
  assert(dynamic_cast<impl1*>(object.get()));
}